

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddArchitectureFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  cmMakefile *pcVar5;
  char *pcVar6;
  pointer pbVar7;
  bool bVar8;
  char *pcVar9;
  long *plVar10;
  size_t sVar11;
  size_type *psVar12;
  iterator __begin3;
  pointer pbVar13;
  string sysrootFlagVar;
  string deploymentTargetFlagVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  archs;
  string local_e0;
  string local_c0;
  string local_a0;
  char *local_80;
  char *local_78;
  string local_70;
  char *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pcVar5 = this->Makefile;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"APPLE","");
  bVar8 = cmMakefile::IsOn(pcVar5,&local_e0);
  if (bVar8) {
    bVar8 = this->EmitUniversalBinaryFlags;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (bVar8 != false) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmGeneratorTarget::GetAppleArchs(target,config,&local_48);
      pcVar5 = this->Makefile;
      paVar1 = &local_e0.field_2;
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"CMAKE_OSX_SYSROOT","");
      pcVar9 = cmMakefile::GetDefinition(pcVar5,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (pcVar9 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else if ((*pcVar9 == '/') && (pcVar9[1] == '\0')) {
        pcVar9 = (char *)0x0;
      }
      paVar2 = &local_a0.field_2;
      local_a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"CMAKE_","");
      local_80 = pcVar9;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_a0,(ulong)(lang->_M_dataplus)._M_p);
      paVar3 = &local_c0.field_2;
      psVar12 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_c0.field_2._M_allocated_capacity = *psVar12;
        local_c0.field_2._8_8_ = plVar10[3];
        local_c0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar12;
        local_c0._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_c0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
      psVar12 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_e0.field_2._M_allocated_capacity = *psVar12;
        local_e0.field_2._8_8_ = plVar10[3];
        local_e0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar12;
        local_e0._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_e0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      local_50 = cmMakefile::GetDefinition(this->Makefile,&local_e0);
      pcVar5 = this->Makefile;
      local_c0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"CMAKE_OSX_DEPLOYMENT_TARGET","");
      local_78 = cmMakefile::GetDefinition(pcVar5,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_","");
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_70,(ulong)(lang->_M_dataplus)._M_p);
      psVar12 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_a0.field_2._M_allocated_capacity = *psVar12;
        local_a0.field_2._8_8_ = plVar10[3];
        local_a0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar12;
        local_a0._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_a0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_a0);
      psVar12 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_c0.field_2._M_allocated_capacity = *psVar12;
        local_c0.field_2._8_8_ = plVar10[3];
        local_c0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar12;
        local_c0._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_c0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pcVar9 = cmMakefile::GetDefinition(this->Makefile,&local_c0);
      pbVar7 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (((local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) && (lang->_M_string_length != 0)) &&
         ((cVar4 = *(lang->_M_dataplus)._M_p,
          pbVar13 = local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, cVar4 == 'F' || (cVar4 == 'C')))) {
        do {
          std::__cxx11::string::append((char *)flags);
          std::__cxx11::string::_M_append((char *)flags,(ulong)(pbVar13->_M_dataplus)._M_p);
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 != pbVar7);
      }
      if ((((local_50 != (char *)0x0) && (*local_50 != '\0')) && (local_80 != (char *)0x0)) &&
         (*local_80 != '\0')) {
        std::__cxx11::string::append((char *)flags);
        std::__cxx11::string::append((char *)flags);
        std::__cxx11::string::append((char *)flags);
        pcVar6 = local_80;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        sVar11 = strlen(local_80);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,pcVar6,pcVar6 + sVar11);
        cmOutputConverter::ConvertToOutputFormat
                  (&local_a0,&this->super_cmOutputConverter,&local_70,SHELL);
        std::__cxx11::string::_M_append((char *)flags,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      if (((pcVar9 != (char *)0x0) && (local_78 != (char *)0x0)) &&
         ((*pcVar9 != '\0' && (*local_78 != '\0')))) {
        std::__cxx11::string::append((char *)flags);
        std::__cxx11::string::append((char *)flags);
        std::__cxx11::string::append((char *)flags);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddArchitectureFlags(std::string& flags,
                                            cmGeneratorTarget const* target,
                                            const std::string& lang,
                                            const std::string& config)
{
  // Only add macOS specific flags on Darwin platforms (macOS and iOS):
  if (this->Makefile->IsOn("APPLE") && this->EmitUniversalBinaryFlags) {
    std::vector<std::string> archs;
    target->GetAppleArchs(config, archs);
    const char* sysroot = this->Makefile->GetDefinition("CMAKE_OSX_SYSROOT");
    if (sysroot && sysroot[0] == '/' && !sysroot[1]) {
      sysroot = nullptr;
    }
    std::string sysrootFlagVar =
      std::string("CMAKE_") + lang + "_SYSROOT_FLAG";
    const char* sysrootFlag = this->Makefile->GetDefinition(sysrootFlagVar);
    const char* deploymentTarget =
      this->Makefile->GetDefinition("CMAKE_OSX_DEPLOYMENT_TARGET");
    std::string deploymentTargetFlagVar =
      std::string("CMAKE_") + lang + "_OSX_DEPLOYMENT_TARGET_FLAG";
    const char* deploymentTargetFlag =
      this->Makefile->GetDefinition(deploymentTargetFlagVar);
    if (!archs.empty() && !lang.empty() &&
        (lang[0] == 'C' || lang[0] == 'F')) {
      for (std::string const& arch : archs) {
        flags += " -arch ";
        flags += arch;
      }
    }

    if (sysrootFlag && *sysrootFlag && sysroot && *sysroot) {
      flags += " ";
      flags += sysrootFlag;
      flags += " ";
      flags += this->ConvertToOutputFormat(sysroot, SHELL);
    }

    if (deploymentTargetFlag && *deploymentTargetFlag && deploymentTarget &&
        *deploymentTarget) {
      flags += " ";
      flags += deploymentTargetFlag;
      flags += deploymentTarget;
    }
  }
}